

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Performance::ShaderCompilerCase::goodEnoughMeasurements
          (ShaderCompilerCase *this,
          vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
          *measurements)

{
  int iVar1;
  size_type sVar2;
  const_reference this_00;
  float fVar3;
  vector<long,_std::allocator<long>_> local_70;
  deInt64 local_48;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<long,_std::allocator<long>_> totalTimesWithoutDraw;
  vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
  *measurements_local;
  ShaderCompilerCase *this_local;
  
  totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)measurements;
  sVar2 = std::
          vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
          ::size(measurements);
  if ((int)sVar2 < this->m_minimumMeasurementCount) {
    this_local._7_1_ = false;
  }
  else {
    sVar2 = std::
            vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
            ::size((vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                    *)totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar2 < this->m_maximumMeasurementCount) {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_38);
      local_3c = 0;
      while( true ) {
        iVar1 = local_3c;
        sVar2 = std::
                vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                ::size((vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                        *)totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((int)sVar2 <= iVar1) break;
        this_00 = std::
                  vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                  ::operator[]((vector<deqp::gles2::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::Measurement>_>
                                *)totalTimesWithoutDraw.
                                  super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)local_3c);
        local_48 = Measurement::totalTimeWithoutDraw(this_00);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)local_38,&local_48);
        local_3c = local_3c + 1;
      }
      vectorLowestPercentage<long>(&local_70,(vector<long,_std::allocator<long>_> *)local_38,0.5);
      fVar3 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&local_70);
      this_local._7_1_ = fVar3 < 0.05;
      std::vector<long,_std::allocator<long>_>::~vector(&local_70);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_38);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ShaderCompilerCase::goodEnoughMeasurements (const vector<Measurement>& measurements) const
{
	if ((int)measurements.size() < m_minimumMeasurementCount)
		return false;
	else
	{
		if ((int)measurements.size() >= m_maximumMeasurementCount)
			return true;
		else
		{
			vector<deInt64> totalTimesWithoutDraw;
			for (int i = 0; i < (int)measurements.size(); i++)
				totalTimesWithoutDraw.push_back(measurements[i].totalTimeWithoutDraw());
			return vectorFloatRelativeMedianAbsoluteDeviation(vectorLowestPercentage(totalTimesWithoutDraw, 0.5f)) < RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD;
		}
	}
}